

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  undefined4 extraout_var;
  FieldDescriptor *field;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  string local_d8;
  undefined1 local_b8 [32];
  undefined6 uStack_98;
  undefined8 local_90;
  int local_88;
  int local_84;
  int local_80;
  bool local_7c;
  DescriptorPool *local_78;
  MessageFactory *pMStack_70;
  CodedOutputStream local_68;
  long *local_48;
  StringOutputStream local_40;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_48 = (long *)CONCAT44(extraout_var,iVar3);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  uVar5 = 0;
  field = (FieldDescriptor *)0x0;
LAB_005cb2ff:
  do {
    pbVar6 = input->buffer_;
    if (pbVar6 < input->buffer_end_) {
      bVar1 = *pbVar6;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_005cb31d;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar6 + 1;
    }
    else {
      uVar4 = 0;
LAB_005cb31d:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
      input->last_tag_ = uVar4;
    }
    if ((int)uVar4 < 0x1a) {
      if (uVar4 != 0) {
        if (uVar4 == 0xc) {
          uVar5 = 1;
          goto LAB_005cb5e2;
        }
        if (uVar4 != 0x10) goto LAB_005cb363;
        pbVar6 = input->buffer_;
        if (pbVar6 < input->buffer_end_) {
          bVar1 = *pbVar6;
          uVar5 = (ulong)bVar1;
          uVar4 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_005cb3d7;
          input->buffer_ = pbVar6 + 1;
        }
        else {
          uVar4 = 0;
LAB_005cb3d7:
          uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          if ((long)uVar5 < 0) goto LAB_005cb5df;
        }
        field = (FieldDescriptor *)(**(code **)(*local_48 + 0x270))(local_48,uVar5 & 0xffffffff);
        if (local_d8._M_string_length == 0) goto LAB_005cb2ff;
        io::ArrayInputStream::ArrayInputStream
                  ((ArrayInputStream *)&local_68,local_d8._M_dataplus._M_p,
                   (int)local_d8._M_string_length,-1);
        local_b8._0_8_ = (uint8 *)0x0;
        local_b8._8_8_ = (uint8 *)0x0;
        uStack_98._0_4_ = 0;
        uStack_98._4_1_ = false;
        uStack_98._5_1_ = false;
        local_b8._24_6_ = 0;
        local_b8._30_2_ = 0;
        local_90._0_4_ = 0x7fffffff;
        local_90._4_4_ = 0;
        local_88 = 0x7fffffff;
        local_84 = io::CodedInputStream::default_recursion_limit_;
        local_80 = io::CodedInputStream::default_recursion_limit_;
        local_7c = true;
        local_78 = (DescriptorPool *)0x0;
        pMStack_70 = (MessageFactory *)0x0;
        local_b8._16_8_ = &local_68;
        io::CodedInputStream::Refresh((CodedInputStream *)local_b8);
        bVar2 = ParseAndMergeMessageSetField
                          ((uint32)uVar5,field,message,(CodedInputStream *)local_b8);
        if (bVar2) {
          local_d8._M_string_length = 0;
          *local_d8._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b8);
          io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&local_68);
          goto LAB_005cb2ff;
        }
        io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b8);
        io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&local_68);
      }
LAB_005cb5df:
      uVar5 = 0;
      goto LAB_005cb5e2;
    }
    if (uVar4 == 0x1a) {
      if ((uint32)uVar5 != 0) {
        bVar2 = ParseAndMergeMessageSetField((uint32)uVar5,field,message,input);
        goto LAB_005cb36f;
      }
      local_b8._0_8_ = local_b8 + 0x10;
      local_b8._8_8_ = (uint8 *)0x0;
      local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
      pbVar6 = input->buffer_;
      if (pbVar6 < input->buffer_end_) {
        bVar1 = *pbVar6;
        uVar5 = (ulong)bVar1;
        uVar4 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_005cb4c0;
        input->buffer_ = pbVar6 + 1;
LAB_005cb4d3:
        uVar8 = (uint)uVar5;
        bVar2 = io::CodedInputStream::ReadString(input,(string *)local_b8,uVar8);
        if (!bVar2) goto LAB_005cb53f;
        io::StringOutputStream::StringOutputStream(&local_40,&local_d8);
        io::CodedOutputStream::CodedOutputStream(&local_68,&local_40.super_ZeroCopyOutputStream);
        if (local_68.buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(&local_68,uVar8);
        }
        else {
          pbVar6 = local_68.buffer_;
          if (uVar8 < 0x80) {
            uVar7 = uVar5 & 0xffffffff;
          }
          else {
            uVar7 = uVar5 & 0xffffffff;
            do {
              uVar8 = (uint)uVar5;
              *pbVar6 = (byte)uVar5 | 0x80;
              uVar7 = uVar7 >> 7;
              pbVar6 = pbVar6 + 1;
              uVar5 = uVar7;
            } while (0x3fff < uVar8);
          }
          *pbVar6 = (byte)uVar7;
          iVar3 = ((int)pbVar6 - (int)local_68.buffer_) + 1;
          local_68.buffer_ = local_68.buffer_ + iVar3;
          local_68.buffer_size_ = local_68.buffer_size_ - iVar3;
        }
        io::CodedOutputStream::WriteRaw(&local_68,(void *)local_b8._0_8_,local_b8._8_4_);
        io::CodedOutputStream::~CodedOutputStream(&local_68);
        io::StringOutputStream::~StringOutputStream(&local_40);
        bVar2 = true;
      }
      else {
        uVar4 = 0;
LAB_005cb4c0:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        if (-1 < (long)uVar5) goto LAB_005cb4d3;
LAB_005cb53f:
        bVar2 = false;
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      uVar5 = 0;
      if (!bVar2) {
LAB_005cb5e2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
        return SUB81(uVar5,0);
      }
    }
    else {
LAB_005cb363:
      bVar2 = SkipField(input,uVar4,(UnknownFieldSet *)0x0);
LAB_005cb36f:
      if (bVar2 == false) goto LAB_005cb5df;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}